

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::HardSwish_x86_avx::forward_inplace(HardSwish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [32];
  int iVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  undefined1 auVar6 [32];
  uint uVar7;
  uint uVar8;
  long lVar9;
  undefined1 (*pauVar10) [32];
  int iVar11;
  uint uVar12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  float fVar18;
  undefined1 auVar19 [16];
  
  iVar3 = bottom_top_blob->c;
  if (0 < (long)iVar3) {
    uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    pp_Var4 = this->_vptr_HardSwish_x86_avx;
    lVar9 = 0;
    auVar14._8_4_ = 0x3f800000;
    auVar14._0_8_ = 0x3f8000003f800000;
    auVar14._12_4_ = 0x3f800000;
    auVar14._16_4_ = 0x3f800000;
    auVar14._20_4_ = 0x3f800000;
    auVar14._24_4_ = 0x3f800000;
    auVar14._28_4_ = 0x3f800000;
    auVar15._8_4_ = 0x3f800000;
    auVar15._0_8_ = 0x3f8000003f800000;
    auVar15._12_4_ = 0x3f800000;
    do {
      pauVar10 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * lVar9 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar7 < 8) {
        uVar12 = 0;
      }
      else {
        iVar11 = 7;
        do {
          fVar1 = *(float *)(&this->field_0xd4 + (long)pp_Var4[-3]);
          auVar2 = *pauVar10;
          fVar18 = *(float *)(&this->field_0xd0 + (long)pp_Var4[-3]);
          auVar17._0_4_ = fVar18 * auVar2._0_4_ + fVar1;
          auVar17._4_4_ = fVar18 * auVar2._4_4_ + fVar1;
          auVar17._8_4_ = fVar18 * auVar2._8_4_ + fVar1;
          auVar17._12_4_ = fVar18 * auVar2._12_4_ + fVar1;
          auVar17._16_4_ = fVar18 * auVar2._16_4_ + fVar1;
          auVar17._20_4_ = fVar18 * auVar2._20_4_ + fVar1;
          auVar17._24_4_ = fVar18 * auVar2._24_4_ + fVar1;
          auVar17._28_4_ = fVar18 + fVar1;
          auVar17 = vmaxps_avx(auVar17,ZEXT1632(ZEXT816(0) << 0x40));
          auVar17 = vminps_avx(auVar17,auVar14);
          auVar6._4_4_ = auVar17._4_4_ * auVar2._4_4_;
          auVar6._0_4_ = auVar17._0_4_ * auVar2._0_4_;
          auVar6._8_4_ = auVar17._8_4_ * auVar2._8_4_;
          auVar6._12_4_ = auVar17._12_4_ * auVar2._12_4_;
          auVar6._16_4_ = auVar17._16_4_ * auVar2._16_4_;
          auVar6._20_4_ = auVar17._20_4_ * auVar2._20_4_;
          auVar6._24_4_ = auVar17._24_4_ * auVar2._24_4_;
          auVar6._28_4_ = auVar17._28_4_;
          *pauVar10 = auVar6;
          pauVar10 = pauVar10 + 1;
          iVar11 = iVar11 + 8;
          uVar12 = uVar7 & 0xfffffff8;
        } while (iVar11 < (int)uVar7);
      }
      uVar8 = uVar12 | 3;
      while ((int)uVar8 < (int)uVar7) {
        fVar1 = *(float *)(&this->field_0xd4 + (long)pp_Var4[-3]);
        fVar18 = *(float *)(&this->field_0xd0 + (long)pp_Var4[-3]);
        auVar19._0_4_ = fVar18 * *(float *)*pauVar10 + fVar1;
        auVar19._4_4_ = fVar18 * *(float *)(*pauVar10 + 4) + fVar1;
        auVar19._8_4_ = fVar18 * *(float *)(*pauVar10 + 8) + fVar1;
        auVar19._12_4_ = fVar18 * *(float *)(*pauVar10 + 0xc) + fVar1;
        auVar19 = vmaxps_avx(auVar19,ZEXT816(0) << 0x40);
        auVar19 = vminps_avx(auVar19,auVar15);
        auVar16._0_4_ = auVar19._0_4_ * *(float *)*pauVar10;
        auVar16._4_4_ = auVar19._4_4_ * *(float *)(*pauVar10 + 4);
        auVar16._8_4_ = auVar19._8_4_ * *(float *)(*pauVar10 + 8);
        auVar16._12_4_ = auVar19._12_4_ * *(float *)(*pauVar10 + 0xc);
        *(undefined1 (*) [16])*pauVar10 = auVar16;
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
        uVar8 = uVar12 + 7;
        uVar12 = uVar12 + 4;
      }
      if (uVar7 - uVar12 != 0 && (int)uVar12 <= (int)uVar7) {
        lVar13 = 0;
        do {
          fVar1 = *(float *)(*pauVar10 + lVar13 * 4);
          p_Var5 = pp_Var4[-3];
          fVar18 = 0.0;
          if (fVar1 < *(float *)(&this->field_0xd8 + (long)p_Var5)) {
LAB_004daf60:
            *(float *)(*pauVar10 + lVar13 * 4) = fVar18;
          }
          else if (fVar1 <= *(float *)(&this->field_0xdc + (long)p_Var5)) {
            fVar18 = (fVar1 * *(float *)(&this->field_0xd0 + (long)p_Var5) +
                     *(float *)(&this->field_0xd4 + (long)p_Var5)) * fVar1;
            goto LAB_004daf60;
          }
          lVar13 = lVar13 + 1;
        } while (uVar7 - uVar12 != (int)lVar13);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar3);
  }
  return 0;
}

Assistant:

int HardSwish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _ans = _mm512_mul_ps(_ans, _p);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _ans = _mm_mul_ps(_ans, _p);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ptr++;
        }
    }

    return 0;
}